

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaa.c
# Opt level: O3

int IDACreateB(void *ida_mem,int *which)

{
  long lVar1;
  int *piVar2;
  void *ida_mem_00;
  int iVar3;
  int iVar4;
  int error_code;
  char *msgfmt;
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "ida_mem = NULL illegal.";
    iVar4 = -0x14;
    ida_mem = (IDAMem)0x0;
    error_code = -0x14;
    iVar3 = 0x29a;
  }
  else if (*(int *)((long)ida_mem + 0x848) == 0) {
    msgfmt = "Illegal attempt to call before calling IDAadjInit.";
    iVar4 = -0x65;
    error_code = -0x65;
    iVar3 = 0x2a3;
  }
  else {
    lVar1 = *(long *)((long)ida_mem + 0x840);
    piVar2 = (int *)malloc(0x88);
    if (piVar2 == (int *)0x0) {
      msgfmt = "A memory request failed.";
      iVar4 = -0x15;
      error_code = -0x15;
      iVar3 = 0x2ad;
    }
    else {
      ida_mem_00 = IDACreate(*ida_mem);
      if (ida_mem_00 != (void *)0x0) {
        IDASetUserData(ida_mem_00,ida_mem);
        iVar3 = *(int *)(lVar1 + 0x38);
        *piVar2 = iVar3;
        *(void **)(piVar2 + 4) = ida_mem_00;
        piVar2[0x16] = 0;
        piVar2[0x17] = 0;
        piVar2[0x18] = 0;
        piVar2[0x19] = 0;
        piVar2[0x12] = 0;
        piVar2[0x13] = 0;
        piVar2[0x14] = 0;
        piVar2[0x15] = 0;
        piVar2[0xe] = 0;
        piVar2[0xf] = 0;
        piVar2[0x10] = 0;
        piVar2[0x11] = 0;
        piVar2[10] = 0;
        piVar2[0xb] = 0;
        piVar2[0xc] = 0;
        piVar2[0xd] = 0;
        piVar2[6] = 0;
        piVar2[7] = 0;
        piVar2[8] = 0;
        piVar2[9] = 0;
        piVar2[0x1c] = 0;
        piVar2[0x1d] = 0;
        piVar2[0x1e] = 0;
        piVar2[0x1f] = 0;
        *(undefined8 *)(piVar2 + 0x20) = *(undefined8 *)(lVar1 + 0x30);
        *(int **)(lVar1 + 0x30) = piVar2;
        *which = iVar3;
        *(int *)(lVar1 + 0x38) = iVar3 + 1;
        return 0;
      }
      msgfmt = "A memory request failed.";
      iVar4 = -0x15;
      error_code = -0x15;
      iVar3 = 0x2b6;
    }
  }
  IDAProcessError((IDAMem)ida_mem,error_code,iVar3,"IDACreateB",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idaa.c"
                  ,msgfmt);
  return iVar4;
}

Assistant:

int IDACreateB(void* ida_mem, int* which)
{
  IDAMem IDA_mem;
  void* ida_memB;
  IDABMem new_IDAB_mem;
  IDAadjMem IDAADJ_mem;

  /* Is the mem OK? */
  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSGAM_NULL_IDAMEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  /* Is ASA initialized ? */
  if (IDA_mem->ida_adjMallocDone == SUNFALSE)
  {
    IDAProcessError(IDA_mem, IDA_NO_ADJ, __LINE__, __func__, __FILE__,
                    MSGAM_NO_ADJ);
    return (IDA_NO_ADJ);
  }
  IDAADJ_mem = IDA_mem->ida_adj_mem;

  /* Allocate a new IDABMem struct. */
  new_IDAB_mem = (IDABMem)malloc(sizeof(struct IDABMemRec));
  if (new_IDAB_mem == NULL)
  {
    IDAProcessError(IDA_mem, IDA_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_MEM_FAIL);
    return (IDA_MEM_FAIL);
  }

  /* Allocate the IDAMem struct needed by this backward problem. */
  ida_memB = IDACreate(IDA_mem->ida_sunctx);
  if (ida_memB == NULL)
  {
    IDAProcessError(IDA_mem, IDA_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_MEM_FAIL);
    return (IDA_MEM_FAIL);
  }

  /* Save ida_mem in ida_memB as user data. */
  IDASetUserData(ida_memB, ida_mem);

  /* Initialize fields in the IDABMem struct. */
  new_IDAB_mem->ida_index = IDAADJ_mem->ia_nbckpbs;
  new_IDAB_mem->IDA_mem   = (IDAMem)ida_memB;

  new_IDAB_mem->ida_res   = NULL;
  new_IDAB_mem->ida_resS  = NULL;
  new_IDAB_mem->ida_rhsQ  = NULL;
  new_IDAB_mem->ida_rhsQS = NULL;

  new_IDAB_mem->ida_user_data = NULL;

  new_IDAB_mem->ida_lmem  = NULL;
  new_IDAB_mem->ida_lfree = NULL;
  new_IDAB_mem->ida_pmem  = NULL;
  new_IDAB_mem->ida_pfree = NULL;

  new_IDAB_mem->ida_yy = NULL;
  new_IDAB_mem->ida_yp = NULL;

  new_IDAB_mem->ida_res_withSensi  = SUNFALSE;
  new_IDAB_mem->ida_rhsQ_withSensi = SUNFALSE;

  /* Attach the new object to the beginning of the linked list IDAADJ_mem->IDAB_mem. */
  new_IDAB_mem->ida_next = IDAADJ_mem->IDAB_mem;
  IDAADJ_mem->IDAB_mem   = new_IDAB_mem;

  /* Return the assigned index. This id is used as identificator and has to be passed
     to IDAInitB and other ***B functions that set the optional inputs for  this
     backward problem. */
  *which = IDAADJ_mem->ia_nbckpbs;

  /*Increase the counter of the backward problems stored. */
  IDAADJ_mem->ia_nbckpbs++;

  return (IDA_SUCCESS);
}